

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_runner.h
# Opt level: O3

bool __thiscall cute::runner_aux::prefixMatcher::operator()(prefixMatcher *this,string *s)

{
  size_type sVar1;
  long lVar2;
  bool bVar3;
  
  bVar3 = false;
  lVar2 = std::__cxx11::string::find((char *)s,(ulong)(this->prefix)._M_dataplus._M_p,0);
  if (lVar2 == 0) {
    sVar1 = (this->prefix)._M_string_length;
    bVar3 = true;
    if (s->_M_string_length != sVar1) {
      bVar3 = (s->_M_dataplus)._M_p[sVar1] == '#';
    }
  }
  return bVar3;
}

Assistant:

bool operator()(std::string const &s) const {
			size_t found=s.find(prefix);
			return found==0 && (s.size()==prefix.size() || s[prefix.size()]=='#');
		}